

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

int variance_final_from_32bit_sum_avx2(__m256i vsse,__m128i vsum,uint *sse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  
  auVar1 = vpaddd_avx(in_ZMM0._16_16_,in_ZMM0._0_16_);
  auVar2 = vpunpckldq_avx(auVar1,in_ZMM1._0_16_);
  auVar1 = vpunpckhdq_avx(auVar1,in_ZMM1._0_16_);
  auVar1 = vpaddd_avx(auVar2,auVar1);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  *(int *)vsum[0] = auVar1._0_4_;
  return auVar1._4_4_;
}

Assistant:

static inline int variance_final_from_32bit_sum_avx2(__m256i vsse, __m128i vsum,
                                                     unsigned int *const sse) {
  // extract the low lane and add it to the high lane
  const __m128i sse_reg_128 = mm256_add_hi_lo_epi32(vsse);

  // unpack sse and sum registers and add
  const __m128i sse_sum_lo = _mm_unpacklo_epi32(sse_reg_128, vsum);
  const __m128i sse_sum_hi = _mm_unpackhi_epi32(sse_reg_128, vsum);
  const __m128i sse_sum = _mm_add_epi32(sse_sum_lo, sse_sum_hi);

  // perform the final summation and extract the results
  const __m128i res = _mm_add_epi32(sse_sum, _mm_srli_si128(sse_sum, 8));
  *((int *)sse) = _mm_cvtsi128_si32(res);
  return _mm_extract_epi32(res, 1);
}